

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_xmlmodelserialiser.cpp
# Opt level: O0

void __thiscall tst_XmlModelSerialiser::basicSaveLoadStream(tst_XmlModelSerialiser *this)

{
  QAbstractItemModel *a;
  QAbstractItemModel *b;
  byte bVar1;
  int iVar2;
  undefined8 *puVar3;
  int __oflag;
  char *__file;
  QModelIndex local_a0;
  QModelIndex local_88;
  QXmlStreamReader local_70 [8];
  QXmlStreamReader readStream;
  QXmlStreamWriter writeStream;
  QTemporaryFile local_58 [8];
  QTemporaryFile serialisedXmlStream;
  XmlModelSerialiser local_38 [8];
  XmlModelSerialiser serialiser;
  QAbstractItemModel *destinationModel;
  QAbstractItemModel *sourceModel;
  tst_XmlModelSerialiser *this_local;
  
  iVar2 = qMetaTypeId<QAbstractItemModel_const*>();
  puVar3 = (undefined8 *)QTest::qData("sourceModel",iVar2);
  a = (QAbstractItemModel *)*puVar3;
  iVar2 = qMetaTypeId<QAbstractItemModel*>();
  puVar3 = (undefined8 *)QTest::qData("destinationModel",iVar2);
  b = (QAbstractItemModel *)*puVar3;
  XmlModelSerialiser::XmlModelSerialiser(local_38,a,(QObject *)0x0);
  __file = (char *)0x101;
  AbstractModelSerialiser::addRoleToSave((int)local_38);
  QTemporaryFile::QTemporaryFile(local_58);
  iVar2 = QTemporaryFile::open(local_58,__file,__oflag);
  bVar1 = QTest::qVerify((bool)((byte)iVar2 & 1),"serialisedXmlStream.open()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_XmlModelSerialiser/tst_xmlmodelserialiser.cpp"
                         ,0x36);
  if ((bVar1 & 1) != 0) {
    QXmlStreamWriter::QXmlStreamWriter((QXmlStreamWriter *)&readStream,(QIODevice *)local_58);
    bVar1 = XmlModelSerialiser::saveModel((QXmlStreamWriter *)local_38);
    bVar1 = QTest::qVerify((bool)(bVar1 & 1),"serialiser.saveModel(writeStream)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_XmlModelSerialiser/tst_xmlmodelserialiser.cpp"
                           ,0x38);
    if ((bVar1 & 1) != 0) {
      bVar1 = QFileDevice::seek((longlong)local_58);
      bVar1 = QTest::qVerify((bool)(bVar1 & 1),"serialisedXmlStream.seek(0)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_XmlModelSerialiser/tst_xmlmodelserialiser.cpp"
                             ,0x39);
      if ((bVar1 & 1) != 0) {
        QXmlStreamReader::QXmlStreamReader(local_70,(QIODevice *)local_58);
        AbstractModelSerialiser::setModel((QAbstractItemModel *)local_38);
        bVar1 = XmlModelSerialiser::loadModel((QXmlStreamReader *)local_38);
        bVar1 = QTest::qVerify((bool)(bVar1 & 1),"serialiser.loadModel(readStream)","",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_XmlModelSerialiser/tst_xmlmodelserialiser.cpp"
                               ,0x3c);
        if ((bVar1 & 1) != 0) {
          QFileDevice::close();
          QModelIndex::QModelIndex(&local_88);
          QModelIndex::QModelIndex(&local_a0);
          tst_SerialiserCommon::checkModelEqual
                    (&this->super_tst_SerialiserCommon,a,b,&local_88,&local_a0,true);
          QObject::deleteLater();
        }
        QXmlStreamReader::~QXmlStreamReader(local_70);
      }
    }
    QXmlStreamWriter::~QXmlStreamWriter((QXmlStreamWriter *)&readStream);
  }
  QTemporaryFile::~QTemporaryFile(local_58);
  XmlModelSerialiser::~XmlModelSerialiser(local_38);
  return;
}

Assistant:

void tst_XmlModelSerialiser::basicSaveLoadStream()
{
    QFETCH(const QAbstractItemModel *, sourceModel);
    QFETCH(QAbstractItemModel *, destinationModel);
    XmlModelSerialiser serialiser(sourceModel, nullptr);
    serialiser.addRoleToSave(Qt::UserRole + 1);
    QTemporaryFile serialisedXmlStream;
    QVERIFY(serialisedXmlStream.open());
    QXmlStreamWriter writeStream(&serialisedXmlStream);
    QVERIFY(serialiser.saveModel(writeStream));
    QVERIFY(serialisedXmlStream.seek(0));
    QXmlStreamReader readStream(&serialisedXmlStream);
    serialiser.setModel(destinationModel);
    QVERIFY(serialiser.loadModel(readStream));
    serialisedXmlStream.close();
    checkModelEqual(sourceModel, destinationModel);
    destinationModel->deleteLater();
}